

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printProducerLocalTime
          (PrettyPrinter *this,OstreamBuffer *out,uint64_t clockValue)

{
  nanoseconds bdt_00;
  type dst;
  OstreamBuffer *in_RDI;
  nanoseconds sinceEpochTz;
  nanoseconds sinceEpoch;
  BrokenDownTime bdt;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  ClockSync *in_stack_ffffffffffffff88;
  nanoseconds in_stack_ffffffffffffff90;
  int tzoffset;
  OstreamBuffer *in_stack_ffffffffffffffa8;
  PrettyPrinter *in_stack_ffffffffffffffb0;
  
  if (*(long *)(*(long *)((in_RDI->_buf)._M_elems + 0x40) + 8) < 1) {
    detail::OstreamBuffer::operator<<
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  else {
    memset(&stack0xffffffffffffffa8,0,0x40);
    bdt_00 = clockToNsSinceEpoch(in_stack_ffffffffffffff88,(uint64_t)in_RDI);
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffff90,
               (int *)(*(long *)((in_RDI->_buf)._M_elems + 0x40) + 0x18));
    dst = std::chrono::operator+
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff88,
                     (duration<long,_std::ratio<1L,_1L>_> *)in_RDI);
    nsSinceEpochToBrokenDownTimeUTC(in_stack_ffffffffffffff90,(BrokenDownTime *)dst.__r);
    tzoffset = (int)((ulong)dst.__r >> 0x20);
    std::__cxx11::string::data();
    printTime(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(BrokenDownTime *)bdt_00.__r,
              tzoffset,(char *)in_stack_ffffffffffffff90.__r);
  }
  return;
}

Assistant:

void PrettyPrinter::printProducerLocalTime(detail::OstreamBuffer& out, std::uint64_t clockValue) const
{
  // TODO(benedek) perf: cache bdt, update instead of complete recompute

  if (std::int64_t(_clockSync->clockFrequency) > 0)
  {
    BrokenDownTime bdt{};
    const std::chrono::nanoseconds sinceEpoch = clockToNsSinceEpoch(*_clockSync, clockValue);
    const std::chrono::nanoseconds sinceEpochTz = sinceEpoch + std::chrono::seconds{_clockSync->tzOffset};
    nsSinceEpochToBrokenDownTimeUTC(sinceEpochTz, bdt);
    printTime(out, bdt, _clockSync->tzOffset, _clockSync->tzName.data());
  }
  else
  {
    out << "no_clock_sync?";
  }
}